

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall
chatra::RuntimeImp::initialize
          (RuntimeImp *this,uint initialThreadCount,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *savedState)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  element_type *dst;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  fd_set *__writefds;
  fd_set *__readfds;
  EVP_PKEY_CTX *src;
  fd_set *__readfds_00;
  fd_set *__readfds_01;
  fd_set *__readfds_02;
  fd_set *__readfds_03;
  fd_set *in_R8;
  timeval *in_R9;
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  undefined1 local_1e0 [24];
  string local_1c8 [32];
  undefined1 local_1a8 [40];
  Reader r;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *savedState_local;
  uint initialThreadCount_local;
  RuntimeImp *this_local;
  
  r.nodeMethodTableMap._M_h._M_single_bucket = (__node_base_ptr)savedState;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  __writefds = (fd_set *)(ulong)uVar1;
  this->multiThread = initialThreadCount != uVar1;
  registerEmbeddedClasses(&this->classes);
  registerEmbeddedFunctions(&this->methods,&this->operators);
  Reader::Reader((Reader *)(local_1a8 + 0x20),this);
  Reader::parse((Reader *)(local_1a8 + 0x20),300,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                r.nodeMethodTableMap._M_h._M_single_bucket);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,"sTable",(allocator *)(local_1e0 + 0x17));
  iVar2 = Reader::select((Reader *)(local_1a8 + 0x20),(int)local_1c8,__readfds,__writefds,in_R8,
                         in_R9);
  StringTable::newInstance((StringTable *)local_1a8,(Reader *)CONCAT44(extraout_var,iVar2));
  std::shared_ptr<chatra::StringTable>::operator=
            (&this->primarySTable,(shared_ptr<chatra::StringTable> *)local_1a8);
  std::shared_ptr<chatra::StringTable>::~shared_ptr((shared_ptr<chatra::StringTable> *)local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1e0 + 0x17));
  dst = std::__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<chatra::StringTable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->primarySTable);
  StringTable::copy((StringTable *)local_1e0,(EVP_PKEY_CTX *)dst,src);
  std::shared_ptr<chatra::StringTable>::operator=
            (&this->distributedSTable,(shared_ptr<chatra::StringTable> *)local_1e0);
  std::shared_ptr<chatra::StringTable>::~shared_ptr((shared_ptr<chatra::StringTable> *)local_1e0);
  launchStorage(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"entity",&local_201);
  iVar2 = Reader::select((Reader *)(local_1a8 + 0x20),(int)local_200,__readfds_00,__writefds,in_R8,
                         in_R9);
  restoreEntityFrames(this,(Reader *)CONCAT44(extraout_var_00,iVar2));
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"map",&local_229);
  iVar2 = Reader::select((Reader *)(local_1a8 + 0x20),(int)local_228,__readfds_01,__writefds,in_R8,
                         in_R9);
  restoreEntityMap(this,(Reader *)CONCAT44(extraout_var_01,iVar2));
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"storage",&local_251);
  iVar2 = Reader::select((Reader *)(local_1a8 + 0x20),(int)local_250,__readfds_02,__writefds,in_R8,
                         in_R9);
  restoreStorage(this,(Reader *)CONCAT44(extraout_var_02,iVar2));
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"state",&local_279);
  iVar2 = Reader::select((Reader *)(local_1a8 + 0x20),(int)local_278,__readfds_03,__writefds,in_R8,
                         in_R9);
  restoreState(this,(Reader *)CONCAT44(extraout_var_03,iVar2));
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  reactivateFinalizerThread(this);
  launchSystem(this,initialThreadCount);
  reactivateThreads(this);
  reactivateTimers(this);
  Reader::~Reader((Reader *)(local_1a8 + 0x20));
  return;
}

Assistant:

void RuntimeImp::initialize(unsigned initialThreadCount, const std::vector<uint8_t>& savedState) {
	multiThread = (initialThreadCount != std::numeric_limits<unsigned>::max());

	registerEmbeddedClasses(classes);
	registerEmbeddedFunctions(methods, operators);

	Reader r(*this);
	r.parse(currentVersion, savedState);

	try {
		primarySTable = StringTable::newInstance(r.select("sTable"));
		distributedSTable = primarySTable->copy();

		// Restore the world
		launchStorage();

		restoreEntityFrames(r.select("entity"));
		restoreEntityMap(r.select("map"));
		restoreStorage(r.select("storage"));
		restoreState(r.select("state"));
	}
	catch (...) {
		throw IllegalArgumentException();
	}

	chatra_assert(storage->audit());
	chatra_assert(!primarySTable->isDirty());

	reactivateFinalizerThread();

	launchSystem(initialThreadCount);
	reactivateThreads();
	reactivateTimers();
}